

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer *__ptr;
  int i;
  char *pcVar6;
  char *in_R9;
  internal iVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  StringIO stringio;
  string stringbuf;
  TypeParam ht_in;
  TypeParam ht_out;
  key_equal local_1a8;
  undefined1 local_198 [8];
  undefined8 local_190;
  AssertHelper local_188;
  string local_180;
  value_type *local_160;
  undefined1 local_158 [8];
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  undefined1 local_130 [112];
  pointer local_c0;
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_158._0_4_ = 0;
  local_158._4_4_ = 0;
  local_150 = local_150 & 0xffffffff00000000;
  local_180._M_dataplus._M_p = (pointer)0x0;
  local_180._M_string_length = local_180._M_string_length & 0xffffffff00000000;
  local_138 = (undefined1  [8])((ulong)local_138 & 0xffffffff00000000);
  local_130._0_8_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            (&local_b0,0,(hasher *)local_158,(key_equal *)&local_180,(allocator_type *)local_138);
  iVar4 = UniqueObjectHelper<int>(2000);
  this_00 = &local_b0.
             super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_00);
  local_b0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.key_info.delkey = -iVar4;
  local_b0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.settings.super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.use_deleted_ =
       true;
  iVar4 = 1;
  do {
    iVar5 = UniqueObjectHelper<int>(iVar4);
    local_158._0_4_ = iVar5;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_138,
             &local_b0.
              super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ,(value_type *)local_158);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 100);
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_138._0_4_ = -iVar4;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_00,(key_type *)local_138);
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_138._0_4_ = -iVar4;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_00,(key_type *)local_138);
  local_150 = 0;
  local_148[0] = 0;
  local_160 = (value_type *)local_158;
  local_158 = (undefined1  [8])local_148;
  bVar3 = google::
          dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                    ((dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00);
  local_180._M_dataplus._M_p._0_1_ = bVar3;
  local_180._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_138,(internal *)&local_180,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x50a,(char *)local_138);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if (local_138 != (undefined1  [8])(local_130 + 8)) {
      operator_delete((void *)local_138);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_198 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
    sVar2 = local_180._M_string_length;
    if ((undefined8 *)local_180._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_180._M_string_length !=
          (undefined8 *)(local_180._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_180._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
  }
  local_198 = (undefined1  [8])0x0;
  local_190 = (undefined8 *)((ulong)local_190._4_4_ << 0x20);
  local_1a8.super_Hasher._0_8_ = (long *)0x0;
  local_1a8.super_Hasher.num_compares_ = 0;
  local_180._M_dataplus._M_p = local_180._M_dataplus._M_p & 0xffffffff00000000;
  local_180._M_string_length = 0;
  google::
  HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_138,0,(hasher *)local_198,&local_1a8,(allocator_type *)&local_180);
  bVar3 = google::
          dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::unserialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                    ((dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)local_130,&local_160);
  local_198[0] = (internal)bVar3;
  local_190 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_198,
               (AssertionResult *)
               "ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x50e,local_180._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if ((long *)local_1a8.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1a8.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_190;
    if (local_190 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_190 != local_190 + 2) {
        operator_delete((undefined8 *)*local_190);
      }
      operator_delete(puVar1);
    }
  }
  iVar4 = UniqueObjectHelper<int>(1);
  local_1a8.super_Hasher.id_ = iVar4;
  local_188.data_._0_4_ = UniqueObjectHelper<int>(1);
  local_188.data_._0_4_ = -(int)local_188.data_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_180,
              (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_130,(int *)&local_188);
  local_180.field_2._8_8_ =
       (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_198,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             (int *)&local_1a8,(int *)local_180._M_string_length);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    if (local_190 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_190;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x510,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if ((long *)local_180._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_180._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_190;
  if (local_190 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_190 != local_190 + 2) {
      operator_delete((undefined8 *)*local_190);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(99);
  local_1a8.super_Hasher.id_ = iVar4;
  local_188.data_._0_4_ = UniqueObjectHelper<int>(99);
  local_188.data_._0_4_ = -(int)local_188.data_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_180,
              (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_130,(int *)&local_188);
  local_180.field_2._8_8_ =
       (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_198,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             (int *)&local_1a8,(int *)local_180._M_string_length);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    if (local_190 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_190;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x511,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if ((long *)local_180._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_180._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_190;
  if (local_190 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_190 != local_190 + 2) {
      operator_delete((undefined8 *)*local_190);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(100);
  local_180._M_dataplus._M_p._0_4_ = -iVar4;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_130,(int *)&local_180);
  bVar3 = pVar8.first == 0xffffffffffffffff;
  local_198[0] = (internal)bVar3;
  local_190 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_198,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x512,local_180._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if ((long *)local_1a8.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1a8.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_190;
    if (local_190 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_190 != local_190 + 2) {
        operator_delete((undefined8 *)*local_190);
      }
      operator_delete(puVar1);
    }
  }
  iVar4 = UniqueObjectHelper<int>(0x15);
  local_1a8.super_Hasher.id_ = iVar4;
  local_188.data_._0_4_ = UniqueObjectHelper<int>(0x15);
  local_188.data_._0_4_ = -(int)local_188.data_;
  google::
  dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_180,
              (dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_130,(int *)&local_188);
  local_180.field_2._8_8_ =
       (HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_138;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_198,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             (int *)&local_1a8,(int *)local_180._M_string_length);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_180);
    if (local_190 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_190;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x513,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
    if ((long *)local_180._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_180._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_190;
  if (local_190 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_190 != local_190 + 2) {
      operator_delete((undefined8 *)*local_190);
    }
    operator_delete(puVar1);
  }
  iVar4 = UniqueObjectHelper<int>(0x16);
  local_180._M_dataplus._M_p._0_4_ = -iVar4;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_130,(int *)&local_180);
  iVar7 = (internal)(pVar8.first == 0xffffffffffffffff);
  local_190 = (undefined8 *)0x0;
  local_198[0] = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_198,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x515,local_180._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if ((long *)local_1a8.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1a8.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_190;
    if (local_190 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_190 != local_190 + 2) {
        operator_delete((undefined8 *)*local_190);
      }
      operator_delete(puVar1);
    }
  }
  iVar4 = UniqueObjectHelper<int>(0x38);
  local_180._M_dataplus._M_p._0_4_ = -iVar4;
  pVar8 = google::
          dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_130,(int *)&local_180);
  local_198[0] = (internal)(pVar8.first == 0xffffffffffffffff);
  local_190 = (undefined8 *)0x0;
  if (!(bool)local_198[0]) {
    testing::Message::Message((Message *)&local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_198,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x516,local_180._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if ((long *)local_1a8.super_Hasher._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1a8.super_Hasher._0_8_ + 8))();
    }
    puVar1 = local_190;
    if (local_190 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_190 != local_190 + 2) {
        operator_delete((undefined8 *)*local_190);
      }
      operator_delete(puVar1);
    }
  }
  local_138 = (undefined1  [8])&PTR__BaseHashtableInterface_00c175a8;
  if (local_c0 != (pointer)0x0) {
    free(local_c0);
  }
  if (local_158 != (undefined1  [8])local_148) {
    operator_delete((void *)local_158);
  }
  local_b0.
  super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c175a8;
  if (local_b0.
      super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.table != (pointer)0x0) {
    free(local_b0.
         super_BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToString) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  string stringbuf;
  StringIO stringio(&stringbuf);
  EXPECT_TRUE(
      ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));

  TypeParam ht_in;
  EXPECT_TRUE(
      ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}